

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void fe_tobytes(uint8_t *s,fe *f)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar2 = 0;
  do {
    if (0x8cccccccccccc < f->v[lVar2]) {
      __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xa6,"void fe_tobytes(uint8_t *, const fe *)");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  uVar3 = f->v[0] + 0xfff8000000000013;
  uVar8 = (f->v[1] + 0xfff8000000000001) - (ulong)(-(uint)(uVar3 >> 0x33) & 0xff);
  uVar10 = (f->v[2] + 0xfff8000000000001) - (ulong)(-(uint)(uVar8 >> 0x33) & 0xff);
  uVar5 = (f->v[3] + 0xfff8000000000001) - (ulong)(-(uint)(uVar10 >> 0x33) & 0xff);
  uVar9 = (f->v[4] + 0xfff8000000000001) - (ulong)(-(uint)(uVar5 >> 0x33) & 0xff);
  uVar4 = -(ulong)((uVar9 & 0x7f8000000000000) != 0);
  uVar6 = (uVar4 & 0x7ffffffffffed) + (uVar3 & 0x7ffffffffffff);
  uVar3 = uVar4 & 0x7ffffffffffff;
  uVar8 = (uVar8 & 0x7ffffffffffff) + uVar3 + (uVar6 >> 0x33);
  uVar10 = (uVar10 & 0x7ffffffffffff) + uVar3 + (uVar8 >> 0x33);
  uVar3 = uVar3 + (uVar5 & 0x7ffffffffffff) + (uVar10 >> 0x33);
  uVar4 = uVar4 + uVar9 + (uVar3 >> 0x33);
  uVar7 = (uint)uVar10;
  uVar1 = (uint)uVar8;
  *s = (uint8_t)uVar6;
  s[1] = (uint8_t)(uVar6 >> 8);
  s[2] = (uint8_t)(uVar6 >> 0x10);
  s[3] = (uint8_t)(uVar6 >> 0x18);
  s[4] = (uint8_t)(uVar6 >> 0x20);
  s[5] = (uint8_t)(uVar6 >> 0x28);
  s[6] = ((byte)(uVar6 >> 0x30) & 7) + (char)uVar8 * '\b';
  s[7] = (uint8_t)(uVar1 >> 5);
  s[8] = (uint8_t)(uVar1 >> 0xd);
  s[9] = (uint8_t)(uVar1 >> 0x15);
  s[10] = (uint8_t)(uVar8 >> 0x1d);
  s[0xb] = (uint8_t)(uVar8 >> 0x25);
  s[0xc] = (byte)(uint)(uVar8 >> 0x2d) & 0x3f | (byte)(uVar7 << 6);
  s[0xd] = (uint8_t)(uVar7 >> 2);
  s[0xe] = (uint8_t)(uVar7 >> 10);
  s[0xf] = (uint8_t)(uVar10 >> 0x12);
  s[0x10] = (uint8_t)(uVar10 >> 0x1a);
  s[0x11] = (uint8_t)(uVar10 >> 0x22);
  s[0x12] = (uint8_t)(uVar10 >> 0x2a);
  s[0x13] = ((byte)(uint)(uVar10 >> 0x32) & 1) + (char)uVar3 * '\x02';
  s[0x14] = (uint8_t)(uVar3 >> 7);
  s[0x15] = (uint8_t)(uVar3 >> 0xf);
  s[0x16] = (uint8_t)(uVar3 >> 0x17);
  s[0x17] = (uint8_t)(uVar3 >> 0x1f);
  s[0x18] = (uint8_t)(uVar3 >> 0x27);
  s[0x19] = (byte)(uint)(uVar3 >> 0x2f) & 0xf | (byte)((int)uVar4 << 4);
  s[0x1a] = (uint8_t)(uVar4 >> 4);
  s[0x1b] = (uint8_t)(uVar4 >> 0xc);
  s[0x1c] = (uint8_t)(uVar4 >> 0x14);
  s[0x1d] = (uint8_t)(uVar4 >> 0x1c);
  s[0x1e] = (uint8_t)(uVar4 >> 0x24);
  s[0x1f] = (byte)(uVar4 >> 0x2c) & 0x7f;
  return;
}

Assistant:

static void fe_tobytes(uint8_t s[32], const fe *f) {
  assert_fe(f->v);
  fiat_25519_to_bytes(s, f->v);
}